

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbClose(sqlite3_file *pFile)

{
  sqlite3_io_methods *p_00;
  sqlite3_mutex *p_01;
  sqlite3_mutex *pVfsMutex;
  int i;
  MemStore *p;
  sqlite3_file *pFile_local;
  
  p_00 = pFile[1].pMethods;
  if (p_00->xUnlock == (_func_int_sqlite3_file_ptr_int *)0x0) {
    memdbEnter((MemStore *)p_00);
  }
  else {
    p_01 = sqlite3MutexAlloc(0xb);
    sqlite3_mutex_enter(p_01);
    for (pVfsMutex._4_4_ = 0; pVfsMutex._4_4_ < memdb_g.nMemStore;
        pVfsMutex._4_4_ = pVfsMutex._4_4_ + 1) {
      if ((sqlite3_io_methods *)memdb_g.apMemStore[pVfsMutex._4_4_] == p_00) {
        memdbEnter((MemStore *)p_00);
        if (*(int *)&p_00->xLock == 1) {
          memdb_g.nMemStore = memdb_g.nMemStore + -1;
          memdb_g.apMemStore[pVfsMutex._4_4_] = memdb_g.apMemStore[memdb_g.nMemStore];
          if (memdb_g.nMemStore == 0) {
            sqlite3_free(memdb_g.apMemStore);
            memdb_g.apMemStore = (MemStore **)0x0;
          }
        }
        break;
      }
    }
    sqlite3_mutex_leave(p_01);
  }
  *(int *)&p_00->xLock = *(int *)&p_00->xLock + -1;
  if (*(int *)&p_00->xLock < 1) {
    if (((ulong)p_00->xSync & 0x100000000) != 0) {
      sqlite3_free(p_00->xWrite);
    }
    memdbLeave((MemStore *)p_00);
    sqlite3_mutex_free((sqlite3_mutex *)p_00->xTruncate);
    sqlite3_free(p_00);
  }
  else {
    memdbLeave((MemStore *)p_00);
  }
  return 0;
}

Assistant:

static int memdbClose(sqlite3_file *pFile){
  MemStore *p = ((MemFile*)pFile)->pStore;
  if( p->zFName ){
    int i;
#ifndef SQLITE_MUTEX_OMIT
    sqlite3_mutex *pVfsMutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_VFS1);
#endif
    sqlite3_mutex_enter(pVfsMutex);
    for(i=0; ALWAYS(i<memdb_g.nMemStore); i++){
      if( memdb_g.apMemStore[i]==p ){
        memdbEnter(p);
        if( p->nRef==1 ){
          memdb_g.apMemStore[i] = memdb_g.apMemStore[--memdb_g.nMemStore];
          if( memdb_g.nMemStore==0 ){
            sqlite3_free(memdb_g.apMemStore);
            memdb_g.apMemStore = 0;
          }
        }
        break;
      }
    }
    sqlite3_mutex_leave(pVfsMutex);
  }else{
    memdbEnter(p);
  }
  p->nRef--;
  if( p->nRef<=0 ){
    if( p->mFlags & SQLITE_DESERIALIZE_FREEONCLOSE ){
      sqlite3_free(p->aData);
    }
    memdbLeave(p);
    sqlite3_mutex_free(p->pMutex);
    sqlite3_free(p);
  }else{
    memdbLeave(p);
  }
  return SQLITE_OK;
}